

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unicode.cc
# Opt level: O0

int onmt::unicode::get_script(code_point_t c,int previous_script)

{
  bool bVar1;
  int iVar2;
  int in_ESI;
  int in_EDI;
  int i;
  int num_extensions;
  UScriptCode extensions [198];
  UScriptCode code;
  UErrorCode error;
  pair<int,_int> *range;
  pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_> *pair;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>_>_>
  *__range2;
  undefined4 in_stack_fffffffffffffc98;
  undefined4 in_stack_fffffffffffffc9c;
  undefined4 in_stack_fffffffffffffca0;
  int iVar3;
  undefined4 in_stack_fffffffffffffca4;
  int local_358 [198];
  int local_40;
  undefined4 local_3c;
  pair<int,_int> *local_38;
  reference local_30;
  pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_> *local_28;
  __normal_iterator<const_std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>_*,_std::vector<std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>_>_>_>
  local_20;
  undefined1 *local_18;
  int local_c;
  int local_8;
  int local_4;
  
  local_18 = compat_scripts;
  local_c = in_ESI;
  local_8 = in_EDI;
  local_20._M_current =
       (pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_> *)
       std::
       vector<std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>_>_>
       ::begin((vector<std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  local_28 = (pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_> *)
             std::
             vector<std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>_>_>
             ::end((vector<std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>_*,_std::vector<std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                       (__normal_iterator<const_std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>_*,_std::vector<std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
    if (!bVar1) {
      local_3c = 0;
      local_40 = uscript_getScript_70(local_8,&local_3c);
      if (local_40 == 0) {
        iVar2 = uscript_getScriptExtensions_70(local_8,local_358,0xc6,&local_3c);
        for (iVar3 = 0; iVar3 < iVar2; iVar3 = iVar3 + 1) {
          if (local_358[iVar3] == local_c) {
            return local_c;
          }
        }
        local_4 = local_358[0];
      }
      else {
        local_4 = local_40;
        if (local_40 == 1) {
          local_4 = local_c;
        }
      }
      return local_4;
    }
    local_30 = __gnu_cxx::
               __normal_iterator<const_std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>_*,_std::vector<std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>_>_>_>
               ::operator*(&local_20);
    local_38 = &local_30->second;
    if ((local_38->first <= local_8) && (local_8 <= (local_30->second).second)) break;
    __gnu_cxx::
    __normal_iterator<const_std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>_*,_std::vector<std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>_>_>_>
    ::operator++(&local_20);
  }
  return (local_30->first).second;
}

Assistant:

int get_script(code_point_t c, int previous_script)
    {
      for (const auto& pair : compat_scripts)
      {
        const auto& range = pair.second;
        if (c >= range.first && c <= range.second)
          return pair.first.second;
      }

      UErrorCode error = U_ZERO_ERROR;
      UScriptCode code = uscript_getScript(c, &error);

      switch (code)
      {
      case USCRIPT_INHERITED:
        return previous_script;
      case USCRIPT_COMMON:
      {
        // For common characters, we return previous_script if it is included in
        // their script extensions.
        UScriptCode extensions[USCRIPT_CODE_LIMIT];
        int num_extensions = uscript_getScriptExtensions(c, extensions, USCRIPT_CODE_LIMIT, &error);
        for (int i = 0; i < num_extensions; ++i)
        {
          if (extensions[i] == previous_script)
            return previous_script;
        }
        return extensions[0];
      }
      default:
        return code;
      }
    }